

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadStringFallback
          (CodedInputStream *this,string *buffer,int size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int current_buffer_size;
  int bytes_to_limit;
  int closest_limit;
  int size_local;
  string *buffer_local;
  CodedInputStream *this_local;
  
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::clear();
  }
  piVar5 = std::min<int>(&this->current_limit_,&this->total_bytes_limit_);
  iVar3 = *piVar5;
  bytes_to_limit = size;
  if (iVar3 != 0x7fffffff) {
    iVar2 = CurrentPosition(this);
    iVar3 = iVar3 - iVar2;
    if (((0 < iVar3) && (0 < size)) && (size <= iVar3)) {
      std::__cxx11::string::reserve((ulong)buffer);
    }
  }
  do {
    iVar3 = BufferSize(this);
    if (bytes_to_limit <= iVar3) {
      std::__cxx11::string::append((char *)buffer,(ulong)this->buffer_);
      Advance(this,bytes_to_limit);
      return true;
    }
    if (iVar3 != 0) {
      std::__cxx11::string::append((char *)buffer,(ulong)this->buffer_);
    }
    bytes_to_limit = bytes_to_limit - iVar3;
    Advance(this,iVar3);
    bVar1 = Refresh(this);
  } while (bVar1);
  return false;
}

Assistant:

bool CodedInputStream::ReadStringFallback(std::string* buffer, int size) {
  if (!buffer->empty()) {
    buffer->clear();
  }

  int closest_limit = std::min(current_limit_, total_bytes_limit_);
  if (closest_limit != INT_MAX) {
    int bytes_to_limit = closest_limit - CurrentPosition();
    if (bytes_to_limit > 0 && size > 0 && size <= bytes_to_limit) {
      buffer->reserve(size);
    }
  }

  int current_buffer_size;
  while ((current_buffer_size = BufferSize()) < size) {
    // Some STL implementations "helpfully" crash on buffer->append(NULL, 0).
    if (current_buffer_size != 0) {
      // Note:  string1.append(string2) is O(string2.size()) (as opposed to
      //   O(string1.size() + string2.size()), which would be bad).
      buffer->append(reinterpret_cast<const char*>(buffer_),
                     current_buffer_size);
    }
    size -= current_buffer_size;
    Advance(current_buffer_size);
    if (!Refresh()) return false;
  }

  buffer->append(reinterpret_cast<const char*>(buffer_), size);
  Advance(size);

  return true;
}